

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_address.cpp
# Opt level: O1

result<unsigned_int> *
sockpp::inet_address::resolve_name(result<unsigned_int> *__return_storage_ptr__,string *saddr)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  error_category *peVar4;
  in_addr ia;
  addrinfo *res;
  addrinfo hints;
  uint local_54;
  addrinfo *local_50;
  addrinfo local_48;
  
  iVar2 = inet_pton(2,(saddr->_M_dataplus)._M_p,&local_54);
  if (iVar2 == 1) {
    __return_storage_ptr__->val_ = local_54;
  }
  else {
    local_48.ai_flags = 0;
    local_48.ai_protocol = 0;
    local_48.ai_canonname = (char *)0x0;
    local_48.ai_next = (addrinfo *)0x0;
    local_48.ai_addrlen = 0;
    local_48._20_4_ = 0;
    local_48.ai_addr = (sockaddr *)0x0;
    local_48.ai_family = 2;
    local_48.ai_socktype = 1;
    iVar2 = getaddrinfo((saddr->_M_dataplus)._M_p,(char *)0x0,&local_48,&local_50);
    if (iVar2 != 0) {
      if (iVar2 == -0xb) {
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        peVar4 = (error_category *)std::_V2::system_category();
      }
      else {
        peVar4 = &gai_errc_category()->super_error_category;
      }
      __return_storage_ptr__->val_ = 0;
      (__return_storage_ptr__->err_)._M_value = iVar2;
      goto LAB_001073ab;
    }
    uVar1 = *(uint *)(local_50->ai_addr->sa_data + 2);
    freeaddrinfo(local_50);
    __return_storage_ptr__->val_ = uVar1;
  }
  (__return_storage_ptr__->err_)._M_value = 0;
  peVar4 = (error_category *)std::_V2::system_category();
LAB_001073ab:
  (__return_storage_ptr__->err_)._M_cat = peVar4;
  return __return_storage_ptr__;
}

Assistant:

result<in_addr_t> inet_address::resolve_name(const string& saddr) noexcept {
#if !defined(_WIN32)
    in_addr ia;
    if (::inet_pton(ADDRESS_FAMILY, saddr.c_str(), &ia) == 1)
        return ia.s_addr;
#endif

    addrinfo *res, hints = addrinfo{};
    hints.ai_family = ADDRESS_FAMILY;
    hints.ai_socktype = SOCK_STREAM;

    int err = ::getaddrinfo(saddr.c_str(), NULL, &hints, &res);

    if (err != 0) {
        error_code ec{};
#if defined(_WIN32)
        ec = error_code{errno, system_category()};
#else
        if (err == EAI_SYSTEM)
            ec = result<>::last_error();
        else
            ec = make_error_code(static_cast<gai_errc>(err));
#endif
        return ec;
    }

    auto ipv4 = reinterpret_cast<sockaddr_in*>(res->ai_addr);
    auto addr = ipv4->sin_addr.s_addr;
    freeaddrinfo(res);
    return addr;
}